

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_tset(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  cTValue *pcVar2;
  cTValue *pcVar3;
  ulong uVar4;
  TValue *pTVar5;
  uint32_t uVar6;
  int iVar7;
  GCtab *mt;
  GCobj *o_1;
  GCtab *t;
  TValue tmp;
  cTValue local_38;
  
  uVar4 = (ulong)(o->field_2).it;
  iVar7 = 100;
  do {
    if ((int)uVar4 == -0xc) {
      uVar1 = (o->u32).lo;
      t = (GCtab *)(ulong)uVar1;
      pcVar2 = lj_tab_get(L,t,k);
      if ((pcVar2->field_2).it != 0xffffffff) {
        t->nomm = '\0';
        if ((t->marked & 4) == 0) {
          return pcVar2;
        }
        uVar4 = (ulong)(L->glref).ptr32;
        t->marked = t->marked & 0xfb;
        (t->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x3c);
        *(uint *)(uVar4 + 0x3c) = uVar1;
        return pcVar2;
      }
      mt = (GCtab *)(ulong)(t->metatable).gcptr32;
      if (((mt == (GCtab *)0x0) || ((mt->nomm & 2) != 0)) ||
         (pcVar3 = lj_meta_cache(mt,MM_newindex,
                                 (GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x104)),
         pcVar3 == (cTValue *)0x0)) {
        t->nomm = '\0';
        if ((t->marked & 4) != 0) {
          uVar4 = (ulong)(L->glref).ptr32;
          t->marked = t->marked & 0xfb;
          (t->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x3c);
          *(uint *)(uVar4 + 0x3c) = uVar1;
        }
        if (pcVar2 != (cTValue *)((ulong)(L->glref).ptr32 + 0x68)) {
          return pcVar2;
        }
        if ((k->field_2).it == 0xffffffff) {
          lj_err_msg(L,LJ_ERR_NILIDX);
        }
        if (((k->field_2).it < 0xfffeffff) && (NAN(k->n))) {
          lj_err_msg(L,LJ_ERR_NANIDX);
        }
        pTVar5 = lj_tab_newkey(L,t,k);
        return pTVar5;
      }
      uVar6 = (pcVar3->field_2).it;
    }
    else {
      pcVar3 = lj_meta_lookup(L,o,MM_newindex);
      uVar6 = (pcVar3->field_2).it;
      if (uVar6 == 0xffffffff) {
        lj_err_optype(L,o,LJ_ERR_OPINDEX);
      }
    }
    if (uVar6 == 0xfffffff7) {
      uVar4 = (ulong)L->base[-1].u32.lo;
      if (*(char *)(uVar4 + 6) == '\0') {
        pTVar5 = L->base + *(byte *)((ulong)*(uint *)(uVar4 + 0x10) - 0x39);
      }
      else {
        pTVar5 = L->top;
      }
      pTVar5->n = 3.663002698267e-320;
      pTVar5[1] = *pcVar3;
      pTVar5[2] = *o;
      pTVar5[3] = *k;
      L->top = pTVar5 + 2;
      return (TValue *)0x0;
    }
    local_38.u64 = pcVar3->u64;
    uVar4 = pcVar3->u64 >> 0x20;
    iVar7 = iVar7 + -1;
    o = &local_38;
    if (iVar7 == 0) {
      lj_err_msg(L,LJ_ERR_SETLOOP);
    }
  } while( true );
}

Assistant:

TValue *lj_meta_tset(lua_State *L, cTValue *o, cTValue *k)
{
  TValue tmp;
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (LJ_LIKELY(!tvisnil(tv))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	return (TValue *)tv;
      } else if (!(mo = lj_meta_fast(L, tabref(t->metatable), MM_newindex))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	if (tv != niltv(L))
	  return (TValue *)tv;
	if (tvisnil(k)) lj_err_msg(L, LJ_ERR_NILIDX);
	else if (tvisint(k)) { setnumV(&tmp, (lua_Number)intV(k)); k = &tmp; }
	else if (tvisnum(k) && tvisnan(k)) lj_err_msg(L, LJ_ERR_NANIDX);
	return lj_tab_newkey(L, t, k);
      }
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_newindex))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_nop, mo, o, k);
      /* L->top+2 = v filled in by caller. */
      return NULL;  /* Trigger metamethod call. */
    }
    copyTV(L, &tmp, mo);
    o = &tmp;
  }
  lj_err_msg(L, LJ_ERR_SETLOOP);
  return NULL;  /* unreachable */
}